

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

bool igColorButton(char *desc_id,ImVec4 col,ImGuiColorEditFlags flags,ImVec2 size)

{
  bool bVar1;
  ImVec4 local_10;
  
  local_10 = col;
  bVar1 = ImGui::ColorButton(desc_id,&local_10,flags,size);
  return bVar1;
}

Assistant:

CIMGUI_API int _igColorButton (char *larg1, ImVec4 const *larg2, ImGuiColorEditFlags *larg3, ImVec2 *larg4) {
  int lresult = (int)0 ;
  char *arg1 = (char *) 0 ;
  ImVec4 arg2 ;
  ImGuiColorEditFlags arg3 ;
  ImVec2 arg4 ;
  bool result;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  try {
    result = (bool)igColorButton((char const *)arg1,arg2,arg3,arg4);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}